

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O2

int Matvec_SparseCSC(SUNMatrix A,N_Vector x,N_Vector y)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  realtype *prVar7;
  realtype *prVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  
  pvVar1 = A->content;
  lVar2 = *(long *)((long)pvVar1 + 0x38);
  lVar3 = *(long *)((long)pvVar1 + 0x20);
  lVar4 = *(long *)((long)pvVar1 + 0x30);
  iVar13 = 1;
  if (lVar3 != 0 && (lVar4 != 0 && lVar2 != 0)) {
    prVar7 = N_VGetArrayPointer(x);
    prVar8 = N_VGetArrayPointer(y);
    iVar13 = 1;
    if (prVar7 != prVar8 && (prVar8 != (realtype *)0x0 && prVar7 != (realtype *)0x0)) {
      plVar5 = (long *)A->content;
      lVar9 = *plVar5;
      lVar11 = 0;
      if (lVar9 < 1) {
        lVar9 = lVar11;
      }
      for (; lVar9 != lVar11; lVar11 = lVar11 + 1) {
        prVar8[lVar11] = 0.0;
      }
      lVar9 = plVar5[1];
      iVar13 = 0;
      if (lVar9 < 1) {
        lVar9 = 0;
      }
      lVar11 = 0;
      while (lVar10 = lVar11, lVar10 != lVar9) {
        lVar6 = *(long *)(lVar2 + 8 + lVar10 * 8);
        for (lVar12 = *(long *)(lVar2 + lVar10 * 8); lVar11 = lVar10 + 1, lVar12 < lVar6;
            lVar12 = lVar12 + 1) {
          lVar11 = *(long *)(lVar4 + lVar12 * 8);
          prVar8[lVar11] = *(double *)(lVar3 + lVar12 * 8) * prVar7[lVar10] + prVar8[lVar11];
        }
      }
    }
  }
  return iVar13;
}

Assistant:

int Matvec_SparseCSC(SUNMatrix A, N_Vector x, N_Vector y)
{
  sunindextype i, j;
  sunindextype *Ap, *Ai;
  realtype *Ax, *xd, *yd;

  /* access data from CSC structure (return if failure) */
  Ap = SM_INDEXPTRS_S(A);
  Ai = SM_INDEXVALS_S(A);
  Ax = SM_DATA_S(A);
  if ((Ap == NULL) || (Ai == NULL) || (Ax == NULL))
    return 1;

  /* access vector data (return if failure) */
  xd = N_VGetArrayPointer(x);
  yd = N_VGetArrayPointer(y);
  if ((xd == NULL) || (yd == NULL) || (xd == yd) )
    return 1;

  /* initialize result */
  for (i=0; i<SM_ROWS_S(A); i++)
    yd[i] = 0.0;

  /* iterate through matrix columns */
  for (j=0; j<SM_COLUMNS_S(A); j++) {

    /* iterate down column of A, performing product */
    for (i=Ap[j]; i<Ap[j+1]; i++)
      yd[Ai[i]] += Ax[i]*xd[j];

  }

  return 0;
}